

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::base_internal::anon_unknown_0::ArenaLock::ArenaLock
          (ArenaLock *this,Arena *arena)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  sigset_t all;
  sigset_t local_90;
  
  this->left_ = false;
  this->mask_valid_ = false;
  this->arena_ = arena;
  if ((arena->flags & 2) != 0) {
    sigfillset(&local_90);
    iVar2 = pthread_sigmask(0,&local_90,(__sigset_t *)&this->mask_);
    this->mask_valid_ = iVar2 == 0;
    arena = this->arena_;
  }
  uVar1 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 & 1) == 0) {
    LOCK();
    uVar3 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
    if (uVar1 == uVar3) {
      (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar1 | 1;
      uVar3 = uVar1;
    }
    UNLOCK();
    if ((uVar3 & 1) == 0) {
      return;
    }
  }
  SpinLock::SlowLock(&arena->mu);
  return;
}

Assistant:

arena_(arena) {
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
      sigset_t all;
      sigfillset(&all);
      mask_valid_ = pthread_sigmask(SIG_BLOCK, &all, &mask_) == 0;
    }
#endif
    arena_->mu.Lock();
  }